

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

CScript * GetScriptForRawPubKey(CScript *__return_storage_ptr__,CPubKey *pubKey)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  long lVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  long in_FS_OFFSET;
  allocator_type local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uchar local_39;
  undefined1 local_38 [28];
  uint uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = 0;
  stack0xffffffffffffffe0 = 0;
  local_38._0_8_ = (char *)0x0;
  local_38._8_8_ = 0;
  lVar4 = 0x21;
  if ((pubKey->vch[0] & 0xfe) != 2) {
    bVar3 = pubKey->vch[0] - 4;
    if (bVar3 < 4) {
      lVar4 = *(long *)(&DAT_00e65840 + (ulong)bVar3 * 8);
    }
    else {
      lVar4 = 0;
    }
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,pubKey->vch,
             pubKey->vch + lVar4,&local_59);
  this = &CScript::operator<<((CScript *)local_38,&local_58)->super_CScriptBase;
  uVar1 = this->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar5 = this;
  }
  local_39 = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this,(uchar *)((long)&ppVar5->_union + (long)(int)uVar2),&local_39);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&__return_storage_ptr__->super_CScriptBase,this);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0x1c < uStack_1c) {
    free((void *)local_38._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript GetScriptForRawPubKey(const CPubKey& pubKey)
{
    return CScript() << std::vector<unsigned char>(pubKey.begin(), pubKey.end()) << OP_CHECKSIG;
}